

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O1

void __thiscall
TPZGeoMesh::BuildElementsAroundNode
          (TPZGeoMesh *this,int64_t currentnode,
          map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>
          *elmap)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  iterator __position;
  mapped_type pTVar4;
  int iVar5;
  int iVar6;
  iterator iVar7;
  long lVar8;
  mapped_type *ppTVar9;
  _Base_ptr p_Var10;
  _Rb_tree_header *p_Var11;
  int iVar12;
  _Self __tmp;
  ulong uVar13;
  TPZGeoElSide neigh;
  _Rb_tree_node_base *local_68;
  long local_50;
  undefined1 local_48 [8];
  mapped_type local_40;
  int local_38;
  
  p_Var1 = &(elmap->_M_t)._M_impl.super__Rb_tree_header;
  iVar7._M_node = (elmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    __position._M_node = iVar7._M_node;
    if ((_Rb_tree_header *)__position._M_node == p_Var1) {
      local_68 = (elmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        do {
          if ((_Rb_tree_header *)local_68 == p_Var1) {
            return;
          }
          p_Var2 = local_68[1]._M_parent;
          local_68 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_68);
          iVar5 = (**(code **)(*(long *)p_Var2 + 0xf0))(p_Var2);
        } while (iVar5 < 1);
        iVar12 = 0;
        do {
          (**(code **)(*(long *)p_Var2 + 0x188))(local_48,p_Var2,iVar12);
          if (((local_40 != (mapped_type)0x0) && (-1 < local_38)) &&
             (iVar6 = (**(code **)(*(long *)local_40 + 0x90))(), 0 < iVar6)) {
            uVar13 = 0;
LAB_0110be41:
            lVar8 = (**(code **)(*(long *)local_40 + 0xa8))(local_40,uVar13 & 0xffffffff);
            pTVar4 = local_40;
            if (lVar8 != currentnode) goto code_r0x0110be57;
            lVar8 = local_40->fId;
            p_Var3 = (elmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var10 = &p_Var1->_M_header;
            for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
                p_Var3 = (&p_Var3->_M_left)[(long)*(size_t *)(p_Var3 + 1) < lVar8]) {
              if (lVar8 <= (long)*(size_t *)(p_Var3 + 1)) {
                p_Var10 = p_Var3;
              }
            }
            p_Var11 = p_Var1;
            if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
               (p_Var11 = (_Rb_tree_header *)p_Var10,
               lVar8 < (long)((_Rb_tree_header *)p_Var10)->_M_node_count)) {
              p_Var11 = p_Var1;
            }
            if (p_Var11 == p_Var1) {
              local_50 = lVar8;
              ppTVar9 = std::
                        map<long,_TPZGeoEl_*,_std::less<long>,_std::allocator<std::pair<const_long,_TPZGeoEl_*>_>_>
                        ::operator[](elmap,&local_50);
              *ppTVar9 = pTVar4;
              local_68 = (elmap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            }
          }
LAB_0110beda:
          iVar12 = iVar12 + 1;
        } while (iVar12 != iVar5);
      } while( true );
    }
    p_Var2 = __position._M_node[1]._M_parent;
    iVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    iVar5 = (**(code **)(*(long *)p_Var2 + 0x90))(p_Var2);
    uVar13 = 0;
    if (0 < iVar5) {
      do {
        lVar8 = (**(code **)(*(long *)p_Var2 + 0xa8))(p_Var2,uVar13 & 0xffffffff);
        if (lVar8 == currentnode) break;
        uVar13 = uVar13 + 1;
      } while ((long)iVar5 != uVar13);
    }
    if (uVar13 == (long)iVar5) {
      std::
      _Rb_tree<long,std::pair<long_const,TPZGeoEl*>,std::_Select1st<std::pair<long_const,TPZGeoEl*>>,std::less<long>,std::allocator<std::pair<long_const,TPZGeoEl*>>>
      ::erase_abi_cxx11_((_Rb_tree<long,std::pair<long_const,TPZGeoEl*>,std::_Select1st<std::pair<long_const,TPZGeoEl*>>,std::less<long>,std::allocator<std::pair<long_const,TPZGeoEl*>>>
                          *)elmap,__position);
    }
  } while( true );
code_r0x0110be57:
  uVar13 = uVar13 + 1;
  if ((long)iVar6 == uVar13) goto LAB_0110beda;
  goto LAB_0110be41;
}

Assistant:

void TPZGeoMesh::BuildElementsAroundNode(int64_t currentnode,map<int64_t,TPZGeoEl*> &elmap)
{
	// first eliminate all elements which do not contain currentnode
	//TPZPix iel = elmap.First();
	map<int64_t, TPZGeoEl *>::iterator ielprev,iel=elmap.begin();
	TPZGeoEl *el;
	int64_t i;
	while(iel!=elmap.end())
	{
		el = iel->second;
		ielprev=iel;
		iel++;//elmap.Next(iel);
		int numnode = el->NNodes();
		for(i=0; i< numnode; i++)
		{
			if(el->NodeIndex(i) == currentnode) break;
		}
		if(i == numnode)
		{
			elmap.erase(ielprev);
		}
	}
	iel = elmap.begin();
	while(iel!=elmap.end())
	{
		el = iel->second;//elmap.Contents(iel);
		iel++;//elmap.Next(iel);
		int nside = el->NSides();
		for(int is=0; is<nside; is++)
		{
			TPZGeoElSide neigh = el->Neighbour(is);
			if(!neigh.Exists()) continue;
			int numnode = neigh.Element()->NNodes();
			for(i=0; i< numnode; i++)
			{
				if(neigh.Element()->NodeIndex(i) == currentnode)
				{
					if(elmap.find(neigh.Element()->Id())==elmap.end())
					{
						// this should be implemented as a stack, so that we dont have to
						// go through the list again each time
						elmap[neigh.Element()->Id()] = neigh.Element();
						iel = elmap.begin();
					}
					break;	// get out of the loop over the nodes
				}
			}
		}
	}
}